

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_definitions_section.hpp
# Opt level: O0

void __thiscall
pstore::repo::linked_definitions::
linked_definitions<pstore::repo::linked_definitions::value_type_const*,void>
          (linked_definitions *this,value_type *begin,value_type *end)

{
  make_unsigned_t<decltype(d)> mVar1;
  value_type *local_28;
  value_type *end_local;
  value_type *begin_local;
  linked_definitions *this_local;
  
  mVar1 = details::udistance<pstore::repo::linked_definitions::value_type_const*>(begin,end);
  this->size_ = mVar1;
  this->unused_ = 0;
  local_28 = this->definitions_;
  do {
    value_type::value_type(local_28);
    local_28 = local_28 + 1;
  } while ((linked_definitions *)local_28 != this + 1);
  std::
  copy<pstore::repo::linked_definitions::value_type_const*,pstore::repo::linked_definitions::value_type*>
            (begin,end,this->definitions_);
  this->unused_ = 0;
  return;
}

Assistant:

linked_definitions::linked_definitions (Iterator begin, Iterator end)
                : size_{details::udistance (begin, end)} {
            std::copy (begin, end, &definitions_[0]);

            unused_ = 0; // to suppress a warning about the field being unused.
            PSTORE_STATIC_ASSERT (std::is_standard_layout<linked_definitions>::value);
            PSTORE_STATIC_ASSERT (alignof (linked_definitions) == 16);
            PSTORE_STATIC_ASSERT (offsetof (linked_definitions, size_) == 0);
            PSTORE_STATIC_ASSERT (offsetof (linked_definitions, unused_) == 8);
            PSTORE_STATIC_ASSERT (offsetof (linked_definitions, definitions_) == 16);
        }